

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writekey.cpp
# Opt level: O2

int writekey_main(int argc,char **argv)

{
  char *pcVar1;
  FILE *__stream;
  bool bVar2;
  int iVar3;
  mcberepair *this;
  string *out;
  basic_istream<char,_std::char_traits<char>_> *in;
  uint uVar4;
  string_view key_00;
  Status status;
  string key;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  string local_920;
  undefined4 local_900;
  undefined4 uStack_8fc;
  undefined4 uStack_8f8;
  undefined4 uStack_8f4;
  DB db;
  
  if ((3 < argc) && (iVar3 = strcmp("help",argv[1]), iVar3 != 0)) {
    mcberepair::slurp_string<char,std::char_traits<char>,std::allocator<char>>
              (&value,(mcberepair *)&std::cin,in);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&db,argv[2],(allocator<char> *)&key);
    std::operator+(&path,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&db,
                   "/db");
    std::__cxx11::string::~string((string *)&db);
    out = (string *)0x0;
    mcberepair::DB::DB(&db,path._M_dataplus._M_p,false,false);
    if ((__uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>)
        db.db_._M_t.super___uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>._M_t.
        super__Tuple_impl<0UL,_leveldb::DB_*,_std::default_delete<leveldb::DB>_>.
        super__Head_base<0UL,_leveldb::DB_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>)0x0) {
      fprintf(_stderr,"ERROR: Opening \'%s\' failed.\n",path._M_dataplus._M_p);
      uVar4 = 1;
    }
    else {
      key._M_dataplus._M_p = (pointer)&key.field_2;
      key._M_string_length = 0;
      key.field_2._M_local_buf[0] = '\0';
      pcVar1 = argv[3];
      this = (mcberepair *)strlen(pcVar1);
      key_00._M_str = (char *)&key;
      key_00._M_len = (size_t)pcVar1;
      bVar2 = mcberepair::decode_key(this,key_00,out);
      if (bVar2) {
        local_920._M_dataplus._M_p = key._M_dataplus._M_p;
        local_920._M_string_length = key._M_string_length;
        local_900 = value._M_dataplus._M_p._0_4_;
        uStack_8fc = value._M_dataplus._M_p._4_4_;
        uStack_8f8 = (undefined4)value._M_string_length;
        uStack_8f4 = value._M_string_length._4_4_;
        (**(code **)(*(long *)db.db_._M_t.
                              super___uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_leveldb::DB_*,_std::default_delete<leveldb::DB>_>
                              .super__Head_base<0UL,_leveldb::DB_*,_false>._M_head_impl + 0x10))
                  (&status);
        __stream = _stderr;
        if (status.state_ != (char *)0x0) {
          pcVar1 = argv[3];
          leveldb::Status::ToString_abi_cxx11_(&local_920,&status);
          fprintf(__stream,"ERROR: Reading key \'%s\' failed: %s\n",pcVar1,
                  local_920._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_920);
        }
        uVar4 = (uint)(status.state_ != (char *)0x0);
        leveldb::Status::~Status(&status);
      }
      else {
        fprintf(_stderr,"ERROR: key \'%s\' is malformed\n",argv[3]);
        uVar4 = 1;
      }
      std::__cxx11::string::~string((string *)&key);
    }
    mcberepair::DB::~DB(&db);
    std::__cxx11::string::~string((string *)&path);
    std::__cxx11::string::~string((string *)&value);
    return uVar4;
  }
  printf("Usage: %s writekey <minecraft_world_dir> <key> < input.bin\n",*argv);
  return 1;
}

Assistant:

int writekey_main(int argc, char* argv[]) {
    if(argc < 4 || strcmp("help", argv[1]) == 0) {
        printf("Usage: %s writekey <minecraft_world_dir> <key> < input.bin\n",
               argv[0]);
        return EXIT_FAILURE;
    }

#ifdef _WIN32
    _setmode(_fileno(stdin), O_BINARY);
#endif

    // slurp from stdin into value before we open db
    auto value = mcberepair::slurp_string(std::cin);

    // construct path for Minecraft BE database
    std::string path = std::string(argv[2]) + "/db";

    // open the database
    mcberepair::DB db{path.c_str()};

    if(!db) {
        fprintf(stderr, "ERROR: Opening '%s' failed.\n", path.c_str());
        return EXIT_FAILURE;
    }

    std::string key;
    if(!mcberepair::decode_key(argv[3], &key)) {
        fprintf(stderr, "ERROR: key '%s' is malformed\n", argv[3]);
        return EXIT_FAILURE;
    }

    leveldb::Status status = db().Put({}, key, value);

    if(!status.ok()) {
        // LCOV_EXCL_START
        fprintf(stderr, "ERROR: Reading key '%s' failed: %s\n", argv[3],
                status.ToString().c_str());
        return EXIT_FAILURE;
        // LCOV_EXCL_STOP
    }

    return EXIT_SUCCESS;
}